

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

int Potassco::xconvert<Clasp::OptParams::UscOption>
              (char *x,Set<Clasp::OptParams::UscOption> *out,char **errPos,int e)

{
  int iVar1;
  KV *pKVar2;
  undefined8 *in_RDX;
  uint *in_RSI;
  char *in_RDI;
  Span<Potassco::KV> SVar3;
  size_t sum;
  size_t i;
  Span<Potassco::KV> em;
  UscOption v;
  uint len;
  uint n;
  char *next;
  char *it;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar4;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  bool bVar5;
  undefined1 in_stack_ffffffffffffff9f;
  uint *in_stack_ffffffffffffffa0;
  ulong uVar6;
  char **in_stack_ffffffffffffffa8;
  size_t pos;
  Span<Potassco::KV> in_stack_ffffffffffffffb0;
  uint local_3c;
  int local_38;
  uint local_34;
  char *local_30;
  char *local_28;
  
  local_38 = 0;
  iVar1 = xconvert((char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   (char **)CONCAT17(in_stack_ffffffffffffff9f,
                                     CONCAT16(in_stack_ffffffffffffff9e,
                                              CONCAT24(in_stack_ffffffffffffff9c,
                                                       in_stack_ffffffffffffff98))),
                   in_stack_ffffffffffffff94);
  local_28 = in_RDI;
  if (iVar1 == 0) {
    local_30 = "";
    local_34 = 0;
    while (iVar1 = Clasp::xconvert((char *)in_stack_ffffffffffffffb0.size,
                                   (UscOption *)in_stack_ffffffffffffffb0.first,
                                   in_stack_ffffffffffffffa8,
                                   (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20)), iVar1 != 0) {
      local_34 = local_3c | local_34;
      local_28 = "";
      local_38 = local_38 + 1;
    }
  }
  else {
    SVar3 = Clasp::enumMap((UscOption *)0x147613);
    uVar6 = 0;
    for (pos = 0; pos != SVar3.size && local_38 == 0; pos = pos + 1) {
      pKVar2 = Span<Potassco::KV>::operator[]((Span<Potassco::KV> *)&stack0xffffffffffffffb0,pos);
      uVar6 = (uint)pKVar2->value | uVar6;
      uVar4 = local_34;
      pKVar2 = Span<Potassco::KV>::operator[]((Span<Potassco::KV> *)&stack0xffffffffffffffb0,pos);
      bVar5 = true;
      if (uVar4 != pKVar2->value) {
        bVar5 = local_34 != 0 && (local_34 & uVar6) == (ulong)local_34;
      }
      local_38 = (uint)bVar5 + local_38;
    }
  }
  if (local_38 != 0) {
    *in_RSI = local_34;
    local_28 = local_30;
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = local_28;
  }
  return local_38;
}

Assistant:

static int xconvert(const char* x, Set<ET>& out, const char** errPos, int e) {
	const char* it = x, *next;
	unsigned n, len = 0u; ET v;
	if (xconvert(it, n, &next, e)) {
		const Potassco::Span<Potassco::KV> em = enumMap(static_cast<ET*>(0));
		for (size_t i = 0, sum = 0; i != em.size && !len; ++i) {
			sum |= static_cast<unsigned>(em[i].value);
			len += (n == static_cast<unsigned>(em[i].value)) || (n && (n & sum) == n);
		}
	}
	else {
		for (next = "", n = 0u; xconvert(it + int(*next == ','), v, &next, e); it = next, ++len) {
			n |= static_cast<unsigned>(v);
		}
	}
	if (len)    { out.val = n; it = next; }
	if (errPos) { *errPos = it; }
	return static_cast<int>(len);
}